

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *
__thiscall
Assimp::FBX::Document::GetConnectionsSequenced
          (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *__return_storage_ptr__,Document *this,uint64_t id,bool is_src,ConnectionMap *conns,
          char **classnames,size_t count)

{
  Token *pTVar1;
  char *__s2;
  _Iter_comp_iter<std::_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>_>
  __comp;
  int iVar2;
  size_t sVar3;
  size_type __n;
  LazyObject *pLVar4;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> _Var5;
  undefined4 uVar6;
  undefined7 in_register_00000009;
  size_t i;
  size_t sVar8;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  pVar9;
  size_t lengths [6];
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *this_00
  ;
  undefined4 in_stack_ffffffffffffff80;
  uint64_t local_70;
  size_t asStack_68 [7];
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> _Var7;
  
  uVar6 = (undefined4)CONCAT71(in_register_00000009,is_src);
  local_70 = id;
  if (classnames == (char **)0x0) {
    __assert_fail("classnames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXDocument.cpp"
                  ,0x241,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (count == 0) {
    __assert_fail("count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXDocument.cpp"
                  ,0x242,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (6 < count) {
    __assert_fail("count <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXDocument.cpp"
                  ,0x243,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  for (sVar8 = 0; count != sVar8; sVar8 = sVar8 + 1) {
    sVar3 = strlen(classnames[sVar8]);
    asStack_68[sVar8] = sVar3;
  }
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = __return_storage_ptr__;
  pVar9 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
          ::equal_range(&conns->_M_t,&local_70);
  _Var7 = pVar9.second._M_node;
  __n = std::
        __distance<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
                  (pVar9.first._M_node._M_node,_Var7._M_node);
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  reserve(__return_storage_ptr__,__n);
  do {
    _Var5 = pVar9.first._M_node;
    if (_Var5._M_node == pVar9.second._M_node._M_node) {
      __comp._M_comp.
      super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
      ._8_4_ = in_stack_ffffffffffffff80;
      __comp._M_comp.
      super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
      ._M_pmf = (offset_in_Connection_to_subr)this_00;
      __comp._M_comp.
      super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
      ._12_4_ = uVar6;
      std::
      __sort<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>>
                ((__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                  )(this_00->
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                  )(this_00->
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish,__comp);
      return this_00;
    }
    if ((char)uVar6 == '\0') {
      pLVar4 = Connection::LazySourceObject((Connection *)_Var5._M_node[1]._M_parent);
    }
    else {
      pLVar4 = Connection::LazyDestinationObject((Connection *)_Var5._M_node[1]._M_parent);
    }
    pTVar1 = pLVar4->element->key_token;
    __s2 = pTVar1->sbegin;
    for (sVar8 = 0; count != sVar8; sVar8 = sVar8 + 1) {
      if (classnames[sVar8] == (char *)0x0) {
        __assert_fail("classnames[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXDocument.cpp"
                      ,0x25a,
                      "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                     );
      }
      sVar3 = (long)pTVar1->send - (long)__s2;
      if (sVar3 == asStack_68[sVar8]) {
        iVar2 = strncmp(classnames[sVar8],__s2,sVar3);
        if (iVar2 == 0) goto LAB_00518eb8;
      }
    }
    if (__s2 == (char *)0x0) {
LAB_00518eb8:
      std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::push_back(this_00,(value_type *)&_Var5._M_node[1]._M_parent);
    }
    _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
    pVar9.second._M_node = _Var7._M_node;
    pVar9.first._M_node = _Var5._M_node;
  } while( true );
}

Assistant:

std::vector<const Connection*> Document::GetConnectionsSequenced(uint64_t id, bool is_src,
    const ConnectionMap& conns,
    const char* const* classnames,
    size_t count) const

{
    ai_assert(classnames);
    ai_assert( count != 0 );
    ai_assert( count <= MAX_CLASSNAMES);

    size_t lengths[MAX_CLASSNAMES];

    const size_t c = count;
    for (size_t i = 0; i < c; ++i) {
        lengths[ i ] = strlen(classnames[i]);
    }

    std::vector<const Connection*> temp;
    const std::pair<ConnectionMap::const_iterator,ConnectionMap::const_iterator> range =
        conns.equal_range(id);

    temp.reserve(std::distance(range.first,range.second));
    for (ConnectionMap::const_iterator it = range.first; it != range.second; ++it) {
        const Token& key = (is_src
            ? (*it).second->LazyDestinationObject()
            : (*it).second->LazySourceObject()
        ).GetElement().KeyToken();

        const char* obtype = key.begin();

        for (size_t i = 0; i < c; ++i) {
            ai_assert(classnames[i]);
            if(static_cast<size_t>(std::distance(key.begin(),key.end())) == lengths[i] && !strncmp(classnames[i],obtype,lengths[i])) {
                obtype = nullptr;
                break;
            }
        }

        if(obtype) {
            continue;
        }

        temp.push_back((*it).second);
    }

    std::sort(temp.begin(), temp.end(), std::mem_fn(&Connection::Compare));
    return temp; // NRVO should handle this
}